

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O2

void __thiscall ArgTest_WStringArg_Test::TestBody(ArgTest_WStringArg_Test *this)

{
  size_t sVar1;
  MockSpec<test_result_(const_wchar_t_*)> *pMVar2;
  MockSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)> *pMVar3;
  basic_string_view<wchar_t> value;
  basic_string_view<wchar_t> value_00;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  arg;
  wchar_t str_data [5];
  StrictMock<mock_visitor<const_wchar_t_*>_> visitor;
  allocator local_139;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_1
  local_138;
  undefined4 local_128;
  _func_int *local_118;
  undefined8 uStack_110;
  undefined4 local_108;
  longlong local_100;
  size_t sStack_f8;
  StrictMock<mock_visitor<const_wchar_t_*>_> local_e0;
  
  local_118 = (_func_int *)0x6500000074;
  uStack_110 = 0x7400000073;
  local_108 = 0;
  sVar1 = wcslen((wchar_t *)&local_118);
  testing::StrictMock<mock_visitor<const_wchar_t_*>_>::StrictMock(&local_e0);
  testing::Matcher<const_wchar_t_*>::Matcher
            ((Matcher<const_wchar_t_*> *)&local_138.string,(wchar_t *)&local_118);
  pMVar2 = mock_visitor<const_wchar_t_*>::gmock_visit
                     (&local_e0.super_mock_visitor<const_wchar_t_*>,
                      (Matcher<const_wchar_t_*> *)&local_138.string);
  testing::internal::MockSpec<test_result_(const_wchar_t_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x16d,"visitor","visit(cstr)");
  testing::internal::MatcherBase<const_wchar_t_*>::~MatcherBase
            ((MatcherBase<const_wchar_t_*> *)&local_138.string);
  local_128 = 10;
  local_138.pointer = &local_118;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<wchar_t_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_e0,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
              *)&local_138.string);
  testing::StrictMock<mock_visitor<const_wchar_t_*>_>::~StrictMock(&local_e0);
  testing::StrictMock<mock_visitor<const_wchar_t_*>_>::StrictMock(&local_e0);
  testing::Matcher<const_wchar_t_*>::Matcher
            ((Matcher<const_wchar_t_*> *)&local_138.string,(wchar_t *)&local_118);
  pMVar2 = mock_visitor<const_wchar_t_*>::gmock_visit
                     (&local_e0.super_mock_visitor<const_wchar_t_*>,
                      (Matcher<const_wchar_t_*> *)&local_138.string);
  testing::internal::MockSpec<test_result_(const_wchar_t_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x16e,"visitor","visit(cstr)");
  testing::internal::MatcherBase<const_wchar_t_*>::~MatcherBase
            ((MatcherBase<const_wchar_t_*> *)&local_138.string);
  local_128 = 10;
  local_138.pointer = &local_118;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<wchar_t_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_e0,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
              *)&local_138.string);
  testing::StrictMock<mock_visitor<const_wchar_t_*>_>::~StrictMock(&local_e0);
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_>::StrictMock
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *)&local_e0);
  value.size_ = sVar1;
  value.data_ = (wchar_t *)&local_118;
  testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>::Matcher
            ((Matcher<fmt::v5::basic_string_view<wchar_t>_> *)&local_138.string,value);
  pMVar3 = mock_visitor<fmt::v5::basic_string_view<wchar_t>_>::gmock_visit
                     ((mock_visitor<fmt::v5::basic_string_view<wchar_t>_> *)
                      &local_e0.super_mock_visitor<const_wchar_t_*>,
                      (Matcher<fmt::v5::basic_string_view<wchar_t>_> *)&local_138.string);
  testing::internal::MockSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)>::InternalExpectedAt
            (pMVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x16f,"visitor","visit(sref)");
  testing::internal::MatcherBase<fmt::v5::basic_string_view<wchar_t>_>::~MatcherBase
            ((MatcherBase<fmt::v5::basic_string_view<wchar_t>_> *)&local_138.string);
  std::__cxx11::wstring::wstring((wstring *)&local_100,(wchar_t *)&local_118,&local_139);
  local_128 = 0xb;
  local_138.long_long_value = local_100;
  local_138.string.size = sStack_f8;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *)&local_e0,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
              *)&local_138.string);
  std::__cxx11::wstring::~wstring((wstring *)&local_100);
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_>::~StrictMock
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *)&local_e0);
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_>::StrictMock
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *)&local_e0);
  value_00.size_ = sVar1;
  value_00.data_ = (wchar_t *)&local_118;
  testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>::Matcher
            ((Matcher<fmt::v5::basic_string_view<wchar_t>_> *)&local_138.string,value_00);
  pMVar3 = mock_visitor<fmt::v5::basic_string_view<wchar_t>_>::gmock_visit
                     ((mock_visitor<fmt::v5::basic_string_view<wchar_t>_> *)
                      &local_e0.super_mock_visitor<const_wchar_t_*>,
                      (Matcher<fmt::v5::basic_string_view<wchar_t>_> *)&local_138.string);
  testing::internal::MockSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)>::InternalExpectedAt
            (pMVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x170,"visitor","visit(sref)");
  testing::internal::MatcherBase<fmt::v5::basic_string_view<wchar_t>_>::~MatcherBase
            ((MatcherBase<fmt::v5::basic_string_view<wchar_t>_> *)&local_138.string);
  local_138.string.size = wcslen((wchar_t *)&local_118);
  local_128 = 0xb;
  local_138.pointer = &local_118;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *)&local_e0,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
              *)&local_138.string);
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_>::~StrictMock
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *)&local_e0);
  return;
}

Assistant:

TEST(ArgTest, WStringArg) {
  wchar_t str_data[] = L"test";
  wchar_t *str = str_data;
  const wchar_t *cstr = str;

  fmt::wstring_view sref(str);
  CHECK_ARG_(wchar_t, cstr, str);
  CHECK_ARG_(wchar_t, cstr, cstr);
  CHECK_ARG_(wchar_t, sref, std::wstring(str));
  CHECK_ARG_(wchar_t, sref, fmt::wstring_view(str));
}